

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assignment.cpp
# Opt level: O2

array<double,_5UL> * testFilter(array<double,_5UL> *__return_storage_ptr__,FilterType *filter)

{
  bool bVar1;
  size_t i;
  long lVar2;
  double dVar3;
  
  std::operator<<((ostream *)&std::cout,"Test response: [");
  bVar1 = true;
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    if (!bVar1) {
      std::operator<<((ostream *)&std::cout,", ");
    }
    dVar3 = Iir::CascadeStages<4,_Iir::DirectFormII>::filter<double>
                      (&(filter->
                        super_PoleFilter<Iir::Butterworth::HighPassBase,_Iir::DirectFormII,_8,_8>).
                        super_CascadeStages<4,_Iir::DirectFormII>,1.0);
    __return_storage_ptr__->_M_elems[lVar2] = dVar3;
    std::ostream::_M_insert<double>(dVar3);
    bVar1 = false;
  }
  std::operator<<((ostream *)&std::cout,"]\n");
  return __return_storage_ptr__;
}

Assistant:

std::array<double, test_len> testFilter(FilterType& filter) {
    std::array <double, test_len> result;
    std::cout << "Test response: [";
    bool first {true};
    for (size_t i = 0; i < test_len; ++i) {
        if (!first) std::cout << ", ";
        first = false;
        result[i] = filter.filter(1.0);
        std::cout << result[i];
    }
    std::cout << "]\n";
    return result;
}